

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matchit.h
# Opt level: O0

void __thiscall
matchit::impl::Id<std::shared_ptr<const_mathiu::impl::Expr>_>::Id
          (Id<std::shared_ptr<const_mathiu::impl::Expr>_> *this,
          Id<std::shared_ptr<const_mathiu::impl::Expr>_> *id)

{
  BlockT *local_68;
  variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  local_60;
  IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_> local_38;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *local_18;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *id_local;
  Id<std::shared_ptr<const_mathiu::impl::Expr>_> *this_local;
  
  local_18 = id;
  id_local = this;
  IdBlockBase<std::shared_ptr<const_mathiu::impl::Expr>_>::IdBlockBase(&local_38);
  std::
  variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>
  ::
  variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,void,void,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,void>
            ((variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>
              *)this,(IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_38);
  IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>::~IdBlock
            ((IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_> *)&local_38);
  local_68 = block(local_18);
  std::
  variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>
  ::
  variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*,void,void,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*,void>
            ((variant<matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>,matchit::impl::IdBlock<std::shared_ptr<mathiu::impl::Expr_const>>*>
              *)&local_60,&local_68);
  std::
  variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::operator=(&this->mBlock,&local_60);
  std::
  variant<matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>,_matchit::impl::IdBlock<std::shared_ptr<const_mathiu::impl::Expr>_>_*>
  ::~variant(&local_60);
  return;
}

Assistant:

constexpr Id(Id const &id) { mBlock = BlockVT{&id.block()}; }